

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void whisper_batch_prep_legacy
               (whisper_batch *batch,whisper_token *tokens,int n_tokens,int n_past,int seq_id)

{
  int i;
  int seq_id_local;
  int n_past_local;
  int n_tokens_local;
  whisper_token *tokens_local;
  whisper_batch *batch_local;
  
  batch->n_tokens = n_tokens;
  for (i = 0; i < n_tokens; i = i + 1) {
    if (tokens != (whisper_token *)0x0) {
      batch->token[i] = tokens[i];
    }
    batch->pos[i] = n_past + i;
    batch->n_seq_id[i] = 1;
    *batch->seq_id[i] = seq_id;
    batch->logits[i] = '\0';
  }
  batch->logits[n_tokens + -1] = '\x01';
  return;
}

Assistant:

static void whisper_batch_prep_legacy(whisper_batch & batch, const whisper_token * tokens, int n_tokens, int n_past, int seq_id) {
    batch.n_tokens = n_tokens;
    for (int i = 0; i < n_tokens; ++i) {
        if (tokens) {
            batch.token[i] = tokens[i];
        }
        batch.pos     [i]    = n_past + i;
        batch.n_seq_id[i]    = 1;
        batch.seq_id  [i][0] = seq_id;
        batch.logits  [i]    = 0;
    }
    batch.logits[n_tokens - 1] = 1;
}